

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmake.cxx
# Opt level: O0

int __thiscall cmake::CheckBuildSystem(cmake *this)

{
  pointer *this_00;
  cmFileTimeComparison *pcVar1;
  bool bVar2;
  int iVar3;
  char *pcVar4;
  ulong uVar5;
  ostream *poVar6;
  cmMakefile *pcVar7;
  cmGlobalGenerator *pcVar8;
  undefined4 extraout_var;
  cmLocalGenerator *pcVar9;
  reference pbVar10;
  char *pcVar11;
  reference pbVar12;
  bool bVar13;
  string local_17f0 [32];
  undefined1 local_17d0 [8];
  ostringstream msg_7;
  int local_1654;
  string local_1650 [4];
  int result_2;
  undefined1 local_1630 [8];
  ostringstream msg_6;
  int local_14b4;
  iterator iStack_14b0;
  int result_1;
  __normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  local_14a8;
  string local_14a0 [8];
  string out_oldest;
  iterator out;
  undefined1 local_1458 [8];
  ostringstream msg_5;
  int local_12dc;
  iterator iStack_12d8;
  int result;
  __normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  local_12d0;
  string local_12c8 [8];
  string dep_newest;
  iterator dep;
  undefined1 local_1280 [8];
  ostringstream msg_4;
  allocator local_1101;
  string local_1100;
  allocator local_10d9;
  string local_10d8;
  allocator local_10b1;
  string local_10b0;
  char *local_1090;
  char *outputsStr;
  string local_1080;
  char *local_1060;
  char *dependsStr;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  outputs;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  depends;
  undefined1 local_1008 [8];
  ostringstream msg_3;
  __normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  local_e90;
  __normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  local_e88;
  __normal_iterator<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  local_e80;
  const_iterator pi;
  string local_e70;
  allocator local_e49;
  string local_e48;
  char *local_e28;
  char *productStr;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  products;
  auto_ptr<cmLocalGenerator> lgd;
  auto_ptr<cmMakefile> local_de8;
  auto_ptr<cmMakefile> mfd;
  allocator local_dc1;
  string local_dc0;
  auto_ptr<cmGlobalGenerator> local_da0;
  auto_ptr<cmGlobalGenerator> ggd;
  string local_d90;
  char *local_d70;
  char *genName;
  string local_d60 [32];
  undefined1 local_d40 [8];
  ostringstream msg_2;
  Snapshot local_bc8;
  auto_ptr<cmMakefile> local_bb0;
  auto_ptr<cmMakefile> mf;
  cmGlobalGenerator gg;
  allocator local_659;
  string local_658;
  allocator local_631;
  string local_630;
  undefined1 local_610 [8];
  cmake cm;
  ostringstream local_340 [8];
  ostringstream msg_1;
  string local_1c8 [48];
  ostringstream local_198 [8];
  ostringstream msg;
  bool verbose;
  cmake *this_local;
  
  pcVar4 = cmsys::SystemTools::GetEnv("VERBOSE");
  bVar13 = false;
  if (pcVar4 != (char *)0x0) {
    pcVar4 = cmsys::SystemTools::GetEnv("CMAKE_NO_VERBOSE");
    bVar13 = pcVar4 == (char *)0x0;
  }
  uVar5 = std::__cxx11::string::empty();
  if ((uVar5 & 1) == 0) {
    pcVar4 = (char *)std::__cxx11::string::c_str();
    bVar2 = cmsys::SystemTools::FileExists(pcVar4);
    if (bVar2) {
      cmake((cmake *)local_610);
      std::allocator<char>::allocator();
      std::__cxx11::string::string((string *)&local_630,"",&local_631);
      SetHomeDirectory((cmake *)local_610,&local_630);
      std::__cxx11::string::~string((string *)&local_630);
      std::allocator<char>::~allocator((allocator<char> *)&local_631);
      std::allocator<char>::allocator();
      std::__cxx11::string::string((string *)&local_658,"",&local_659);
      SetHomeOutputDirectory((cmake *)local_610,&local_658);
      std::__cxx11::string::~string((string *)&local_658);
      std::allocator<char>::~allocator((allocator<char> *)&local_659);
      GetCurrentSnapshot((Snapshot *)&gg.InstallTargetEnabled,(cmake *)local_610);
      cmState::Snapshot::SetDefaultDefinitions((Snapshot *)&gg.InstallTargetEnabled);
      cmGlobalGenerator::cmGlobalGenerator((cmGlobalGenerator *)&mf,(cmake *)local_610);
      pcVar7 = (cmMakefile *)operator_new(0x730);
      GetCurrentSnapshot(&local_bc8,(cmake *)local_610);
      cmMakefile::cmMakefile(pcVar7,(cmGlobalGenerator *)&mf,&local_bc8);
      cmsys::auto_ptr<cmMakefile>::auto_ptr(&local_bb0,pcVar7);
      pcVar7 = cmsys::auto_ptr<cmMakefile>::operator->(&local_bb0);
      pcVar4 = (char *)std::__cxx11::string::c_str();
      bVar2 = cmMakefile::ReadListFile(pcVar7,pcVar4);
      if ((!bVar2) || (bVar2 = cmSystemTools::GetErrorOccuredFlag(), bVar2)) {
        if (bVar13 != false) {
          std::__cxx11::ostringstream::ostringstream((ostringstream *)local_d40);
          poVar6 = std::operator<<((ostream *)local_d40,"Re-run cmake error reading : ");
          poVar6 = std::operator<<(poVar6,(string *)&this->CheckBuildSystemArgument);
          std::operator<<(poVar6,"\n");
          std::__cxx11::ostringstream::str();
          pcVar4 = (char *)std::__cxx11::string::c_str();
          cmSystemTools::Stdout(pcVar4);
          std::__cxx11::string::~string(local_d60);
          std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_d40);
        }
        this_local._4_4_ = 1;
        genName._4_4_ = 1;
      }
      else {
        if ((this->ClearBuildSystem & 1U) != 0) {
          pcVar7 = cmsys::auto_ptr<cmMakefile>::operator->(&local_bb0);
          std::allocator<char>::allocator();
          std::__cxx11::string::string
                    ((string *)&local_d90,"CMAKE_DEPENDS_GENERATOR",(allocator *)((long)&ggd.x_ + 7)
                    );
          pcVar4 = cmMakefile::GetDefinition(pcVar7,&local_d90);
          std::__cxx11::string::~string((string *)&local_d90);
          std::allocator<char>::~allocator((allocator<char> *)((long)&ggd.x_ + 7));
          if ((pcVar4 == (char *)0x0) || (local_d70 = pcVar4, *pcVar4 == '\0')) {
            local_d70 = "Unix Makefiles";
          }
          pcVar4 = local_d70;
          std::allocator<char>::allocator();
          std::__cxx11::string::string((string *)&local_dc0,pcVar4,&local_dc1);
          pcVar8 = CreateGlobalGenerator(this,&local_dc0);
          cmsys::auto_ptr<cmGlobalGenerator>::auto_ptr(&local_da0,pcVar8);
          std::__cxx11::string::~string((string *)&local_dc0);
          std::allocator<char>::~allocator((allocator<char> *)&local_dc1);
          pcVar8 = cmsys::auto_ptr<cmGlobalGenerator>::get(&local_da0);
          if (pcVar8 != (cmGlobalGenerator *)0x0) {
            GetCurrentSnapshot((Snapshot *)&mfd,(cmake *)local_610);
            cmState::Snapshot::SetDefaultDefinitions((Snapshot *)&mfd);
            pcVar7 = (cmMakefile *)operator_new(0x730);
            pcVar8 = cmsys::auto_ptr<cmGlobalGenerator>::get(&local_da0);
            GetCurrentSnapshot((Snapshot *)&lgd,(cmake *)local_610);
            cmMakefile::cmMakefile(pcVar7,pcVar8,(Snapshot *)&lgd);
            cmsys::auto_ptr<cmMakefile>::auto_ptr(&local_de8,pcVar7);
            pcVar8 = cmsys::auto_ptr<cmGlobalGenerator>::operator->(&local_da0);
            pcVar7 = cmsys::auto_ptr<cmMakefile>::get(&local_de8);
            iVar3 = (*pcVar8->_vptr_cmGlobalGenerator[2])(pcVar8,pcVar7);
            this_00 = &products.
                       super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                       ._M_impl.super__Vector_impl_data._M_end_of_storage;
            cmsys::auto_ptr<cmLocalGenerator>::auto_ptr
                      ((auto_ptr<cmLocalGenerator> *)this_00,
                       (cmLocalGenerator *)CONCAT44(extraout_var,iVar3));
            pcVar9 = cmsys::auto_ptr<cmLocalGenerator>::operator->
                               ((auto_ptr<cmLocalGenerator> *)this_00);
            pcVar7 = cmsys::auto_ptr<cmMakefile>::get(&local_de8);
            (*pcVar9->_vptr_cmLocalGenerator[9])(pcVar9,pcVar7,(ulong)bVar13);
            cmsys::auto_ptr<cmLocalGenerator>::~auto_ptr
                      ((auto_ptr<cmLocalGenerator> *)
                       &products.
                        super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                        ._M_impl.super__Vector_impl_data._M_end_of_storage);
            cmsys::auto_ptr<cmMakefile>::~auto_ptr(&local_de8);
          }
          cmsys::auto_ptr<cmGlobalGenerator>::~auto_ptr(&local_da0);
        }
        std::
        vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ::vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  *)&productStr);
        pcVar7 = cmsys::auto_ptr<cmMakefile>::operator->(&local_bb0);
        std::allocator<char>::allocator();
        std::__cxx11::string::string((string *)&local_e48,"CMAKE_MAKEFILE_PRODUCTS",&local_e49);
        pcVar4 = cmMakefile::GetDefinition(pcVar7,&local_e48);
        std::__cxx11::string::~string((string *)&local_e48);
        std::allocator<char>::~allocator((allocator<char> *)&local_e49);
        local_e28 = pcVar4;
        if (pcVar4 != (char *)0x0) {
          std::allocator<char>::allocator();
          std::__cxx11::string::string
                    ((string *)&local_e70,pcVar4,(allocator *)((long)&pi._M_current + 7));
          cmSystemTools::ExpandListArgument
                    (&local_e70,
                     (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                      *)&productStr,false);
          std::__cxx11::string::~string((string *)&local_e70);
          std::allocator<char>::~allocator((allocator<char> *)((long)&pi._M_current + 7));
        }
        local_e88._M_current =
             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             std::
             vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             ::begin((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                      *)&productStr);
        __gnu_cxx::
        __normal_iterator<std::__cxx11::string_const*,std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>>
        ::__normal_iterator<std::__cxx11::string*>
                  ((__normal_iterator<std::__cxx11::string_const*,std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>>
                    *)&local_e80,&local_e88);
        while( true ) {
          local_e90._M_current =
               (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
               std::
               vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               ::end((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                      *)&productStr);
          bVar2 = __gnu_cxx::operator!=(&local_e80,&local_e90);
          if (!bVar2) break;
          __gnu_cxx::
          __normal_iterator<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
          ::operator->(&local_e80);
          pcVar4 = (char *)std::__cxx11::string::c_str();
          bVar2 = cmsys::SystemTools::FileExists(pcVar4);
          if (!bVar2) {
            pbVar10 = __gnu_cxx::
                      __normal_iterator<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                      ::operator*(&local_e80);
            bVar2 = cmsys::SystemTools::FileIsSymlink(pbVar10);
            if (!bVar2) {
              if (bVar13 != false) {
                std::__cxx11::ostringstream::ostringstream((ostringstream *)local_1008);
                poVar6 = std::operator<<((ostream *)local_1008,"Re-run cmake, missing byproduct: ");
                pbVar10 = __gnu_cxx::
                          __normal_iterator<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                          ::operator*(&local_e80);
                poVar6 = std::operator<<(poVar6,(string *)pbVar10);
                std::operator<<(poVar6,"\n");
                std::__cxx11::ostringstream::str();
                pcVar4 = (char *)std::__cxx11::string::c_str();
                cmSystemTools::Stdout(pcVar4);
                std::__cxx11::string::~string
                          ((string *)
                           &depends.
                            super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                            ._M_impl.super__Vector_impl_data._M_end_of_storage);
                std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_1008);
              }
              this_local._4_4_ = 1;
              genName._4_4_ = 1;
              goto LAB_006b70e5;
            }
          }
          __gnu_cxx::
          __normal_iterator<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
          ::operator++(&local_e80);
        }
        std::
        vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ::vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  *)&outputs.
                     super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                     ._M_impl.super__Vector_impl_data._M_end_of_storage);
        std::
        vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ::vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  *)&dependsStr);
        pcVar7 = cmsys::auto_ptr<cmMakefile>::operator->(&local_bb0);
        std::allocator<char>::allocator();
        std::__cxx11::string::string
                  ((string *)&local_1080,"CMAKE_MAKEFILE_DEPENDS",
                   (allocator *)((long)&outputsStr + 7));
        pcVar4 = cmMakefile::GetDefinition(pcVar7,&local_1080);
        std::__cxx11::string::~string((string *)&local_1080);
        std::allocator<char>::~allocator((allocator<char> *)((long)&outputsStr + 7));
        local_1060 = pcVar4;
        pcVar7 = cmsys::auto_ptr<cmMakefile>::operator->(&local_bb0);
        std::allocator<char>::allocator();
        std::__cxx11::string::string((string *)&local_10b0,"CMAKE_MAKEFILE_OUTPUTS",&local_10b1);
        pcVar11 = cmMakefile::GetDefinition(pcVar7,&local_10b0);
        std::__cxx11::string::~string((string *)&local_10b0);
        std::allocator<char>::~allocator((allocator<char> *)&local_10b1);
        pcVar4 = local_1060;
        local_1090 = pcVar11;
        if ((local_1060 != (char *)0x0) && (pcVar11 != (char *)0x0)) {
          std::allocator<char>::allocator();
          std::__cxx11::string::string((string *)&local_10d8,pcVar4,&local_10d9);
          cmSystemTools::ExpandListArgument
                    (&local_10d8,
                     (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                      *)&outputs.
                         super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                         ._M_impl.super__Vector_impl_data._M_end_of_storage,false);
          std::__cxx11::string::~string((string *)&local_10d8);
          std::allocator<char>::~allocator((allocator<char> *)&local_10d9);
          pcVar4 = local_1090;
          std::allocator<char>::allocator();
          std::__cxx11::string::string((string *)&local_1100,pcVar4,&local_1101);
          cmSystemTools::ExpandListArgument
                    (&local_1100,
                     (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                      *)&dependsStr,false);
          std::__cxx11::string::~string((string *)&local_1100);
          std::allocator<char>::~allocator((allocator<char> *)&local_1101);
        }
        bVar2 = std::
                vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                ::empty((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                         *)&outputs.
                            super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                            ._M_impl.super__Vector_impl_data._M_end_of_storage);
        if ((bVar2) ||
           (bVar2 = std::
                    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                    ::empty((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                             *)&dependsStr), bVar2)) {
          if (bVar13 != false) {
            std::__cxx11::ostringstream::ostringstream((ostringstream *)local_1280);
            std::operator<<((ostream *)local_1280,
                            "Re-run cmake no CMAKE_MAKEFILE_DEPENDS or CMAKE_MAKEFILE_OUTPUTS :\n");
            std::__cxx11::ostringstream::str();
            pcVar4 = (char *)std::__cxx11::string::c_str();
            cmSystemTools::Stdout(pcVar4);
            std::__cxx11::string::~string((string *)&dep);
            std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_1280);
          }
          this_local._4_4_ = 1;
          genName._4_4_ = 1;
        }
        else {
          dep_newest.field_2._8_8_ =
               std::
               vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               ::begin((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                        *)&outputs.
                           super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                           ._M_impl.super__Vector_impl_data._M_end_of_storage);
          local_12d0 = __gnu_cxx::
                       __normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                       ::operator++((__normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                                     *)((long)&dep_newest.field_2 + 8),0);
          pbVar12 = __gnu_cxx::
                    __normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                    ::operator*(&local_12d0);
          std::__cxx11::string::string(local_12c8,(string *)pbVar12);
          while( true ) {
            iStack_12d8 = std::
                          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                          ::end((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                 *)&outputs.
                                    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                    ._M_impl.super__Vector_impl_data._M_end_of_storage);
            bVar2 = __gnu_cxx::operator!=
                              ((__normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                                *)((long)&dep_newest.field_2 + 8),&stack0xffffffffffffed28);
            if (!bVar2) break;
            local_12dc = 0;
            pcVar1 = this->FileComparison;
            pcVar4 = (char *)std::__cxx11::string::c_str();
            __gnu_cxx::
            __normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
            ::operator->((__normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                          *)((long)&dep_newest.field_2 + 8));
            pcVar11 = (char *)std::__cxx11::string::c_str();
            bVar2 = cmFileTimeComparison::FileTimeCompare(pcVar1,pcVar4,pcVar11,&local_12dc);
            if (!bVar2) {
              if (bVar13 != false) {
                std::__cxx11::ostringstream::ostringstream((ostringstream *)local_1458);
                std::operator<<((ostream *)local_1458,
                                "Re-run cmake: build system dependency is missing\n");
                std::__cxx11::ostringstream::str();
                pcVar4 = (char *)std::__cxx11::string::c_str();
                cmSystemTools::Stdout(pcVar4);
                std::__cxx11::string::~string((string *)&out);
                std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_1458);
              }
              this_local._4_4_ = 1;
              genName._4_4_ = 1;
              goto LAB_006b7095;
            }
            if (local_12dc < 0) {
              pbVar12 = __gnu_cxx::
                        __normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                        ::operator*((__normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                                     *)((long)&dep_newest.field_2 + 8));
              std::__cxx11::string::operator=(local_12c8,(string *)pbVar12);
            }
            __gnu_cxx::
            __normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
            ::operator++((__normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                          *)((long)&dep_newest.field_2 + 8));
          }
          out_oldest.field_2._8_8_ =
               std::
               vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               ::begin((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                        *)&dependsStr);
          local_14a8 = __gnu_cxx::
                       __normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                       ::operator++((__normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                                     *)((long)&out_oldest.field_2 + 8),0);
          pbVar12 = __gnu_cxx::
                    __normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                    ::operator*(&local_14a8);
          std::__cxx11::string::string(local_14a0,(string *)pbVar12);
          while( true ) {
            iStack_14b0 = std::
                          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                          ::end((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                 *)&dependsStr);
            bVar2 = __gnu_cxx::operator!=
                              ((__normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                                *)((long)&out_oldest.field_2 + 8),&stack0xffffffffffffeb50);
            if (!bVar2) break;
            local_14b4 = 0;
            pcVar1 = this->FileComparison;
            pcVar4 = (char *)std::__cxx11::string::c_str();
            __gnu_cxx::
            __normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
            ::operator->((__normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                          *)((long)&out_oldest.field_2 + 8));
            pcVar11 = (char *)std::__cxx11::string::c_str();
            bVar2 = cmFileTimeComparison::FileTimeCompare(pcVar1,pcVar4,pcVar11,&local_14b4);
            if (!bVar2) {
              if (bVar13 != false) {
                std::__cxx11::ostringstream::ostringstream((ostringstream *)local_1630);
                std::operator<<((ostream *)local_1630,
                                "Re-run cmake: build system output is missing\n");
                std::__cxx11::ostringstream::str();
                pcVar4 = (char *)std::__cxx11::string::c_str();
                cmSystemTools::Stdout(pcVar4);
                std::__cxx11::string::~string(local_1650);
                std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_1630);
              }
              this_local._4_4_ = 1;
              goto LAB_006b7079;
            }
            if (0 < local_14b4) {
              pbVar12 = __gnu_cxx::
                        __normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                        ::operator*((__normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                                     *)((long)&out_oldest.field_2 + 8));
              std::__cxx11::string::operator=(local_14a0,(string *)pbVar12);
            }
            __gnu_cxx::
            __normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
            ::operator++((__normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                          *)((long)&out_oldest.field_2 + 8));
          }
          local_1654 = 0;
          pcVar1 = this->FileComparison;
          pcVar4 = (char *)std::__cxx11::string::c_str();
          pcVar11 = (char *)std::__cxx11::string::c_str();
          bVar2 = cmFileTimeComparison::FileTimeCompare(pcVar1,pcVar4,pcVar11,&local_1654);
          if ((bVar2) && (-1 < local_1654)) {
            this_local._4_4_ = 0;
          }
          else {
            if (bVar13 != false) {
              std::__cxx11::ostringstream::ostringstream((ostringstream *)local_17d0);
              poVar6 = std::operator<<((ostream *)local_17d0,"Re-run cmake file: ");
              poVar6 = std::operator<<(poVar6,local_14a0);
              poVar6 = std::operator<<(poVar6," older than: ");
              poVar6 = std::operator<<(poVar6,local_12c8);
              std::operator<<(poVar6,"\n");
              std::__cxx11::ostringstream::str();
              pcVar4 = (char *)std::__cxx11::string::c_str();
              cmSystemTools::Stdout(pcVar4);
              std::__cxx11::string::~string(local_17f0);
              std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_17d0);
            }
            this_local._4_4_ = 1;
          }
LAB_006b7079:
          genName._4_4_ = 1;
          std::__cxx11::string::~string(local_14a0);
LAB_006b7095:
          std::__cxx11::string::~string(local_12c8);
        }
        std::
        vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   *)&dependsStr);
        std::
        vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   *)&outputs.
                      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                      ._M_impl.super__Vector_impl_data._M_end_of_storage);
LAB_006b70e5:
        std::
        vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   *)&productStr);
      }
      cmsys::auto_ptr<cmMakefile>::~auto_ptr(&local_bb0);
      cmGlobalGenerator::~cmGlobalGenerator((cmGlobalGenerator *)&mf);
      ~cmake((cmake *)local_610);
    }
    else {
      if (bVar13 != false) {
        std::__cxx11::ostringstream::ostringstream(local_340);
        poVar6 = std::operator<<((ostream *)local_340,"Re-run cmake missing file: ");
        poVar6 = std::operator<<(poVar6,(string *)&this->CheckBuildSystemArgument);
        std::operator<<(poVar6,"\n");
        std::__cxx11::ostringstream::str();
        pcVar4 = (char *)std::__cxx11::string::c_str();
        cmSystemTools::Stdout(pcVar4);
        std::__cxx11::string::~string((string *)&cm.CurrentSnapshot.Position.Position);
        std::__cxx11::ostringstream::~ostringstream(local_340);
      }
      this_local._4_4_ = 1;
    }
  }
  else {
    if (bVar13) {
      std::__cxx11::ostringstream::ostringstream(local_198);
      std::operator<<((ostream *)local_198,"Re-run cmake no build system arguments\n");
      std::__cxx11::ostringstream::str();
      pcVar4 = (char *)std::__cxx11::string::c_str();
      cmSystemTools::Stdout(pcVar4);
      std::__cxx11::string::~string(local_1c8);
      std::__cxx11::ostringstream::~ostringstream(local_198);
    }
    this_local._4_4_ = 1;
  }
  return this_local._4_4_;
}

Assistant:

int cmake::CheckBuildSystem()
{
  // We do not need to rerun CMake.  Check dependency integrity.  Use
  // the make system's VERBOSE environment variable to enable verbose
  // output. This can be skipped by setting CMAKE_NO_VERBOSE (which is set
  // by the Eclipse and KDevelop generators).
  bool verbose = ((cmSystemTools::GetEnv("VERBOSE") != 0)
                   && (cmSystemTools::GetEnv("CMAKE_NO_VERBOSE") == 0));

  // This method will check the integrity of the build system if the
  // option was given on the command line.  It reads the given file to
  // determine whether CMake should rerun.

  // If no file is provided for the check, we have to rerun.
  if(this->CheckBuildSystemArgument.empty())
    {
    if(verbose)
      {
      std::ostringstream msg;
      msg << "Re-run cmake no build system arguments\n";
      cmSystemTools::Stdout(msg.str().c_str());
      }
    return 1;
    }

  // If the file provided does not exist, we have to rerun.
  if(!cmSystemTools::FileExists(this->CheckBuildSystemArgument.c_str()))
    {
    if(verbose)
      {
      std::ostringstream msg;
      msg << "Re-run cmake missing file: "
          << this->CheckBuildSystemArgument << "\n";
      cmSystemTools::Stdout(msg.str().c_str());
      }
    return 1;
    }

  // Read the rerun check file and use it to decide whether to do the
  // global generate.
  cmake cm;
  cm.SetHomeDirectory("");
  cm.SetHomeOutputDirectory("");
  cm.GetCurrentSnapshot().SetDefaultDefinitions();
  cmGlobalGenerator gg(&cm);
  cmsys::auto_ptr<cmMakefile> mf(new cmMakefile(&gg, cm.GetCurrentSnapshot()));
  if(!mf->ReadListFile(this->CheckBuildSystemArgument.c_str()) ||
     cmSystemTools::GetErrorOccuredFlag())
    {
    if(verbose)
      {
      std::ostringstream msg;
      msg << "Re-run cmake error reading : "
          << this->CheckBuildSystemArgument << "\n";
      cmSystemTools::Stdout(msg.str().c_str());
      }
    // There was an error reading the file.  Just rerun.
    return 1;
    }

  if(this->ClearBuildSystem)
    {
    // Get the generator used for this build system.
    const char* genName = mf->GetDefinition("CMAKE_DEPENDS_GENERATOR");
    if(!genName || genName[0] == '\0')
      {
      genName = "Unix Makefiles";
      }

    // Create the generator and use it to clear the dependencies.
    cmsys::auto_ptr<cmGlobalGenerator>
      ggd(this->CreateGlobalGenerator(genName));
    if(ggd.get())
      {
      cm.GetCurrentSnapshot().SetDefaultDefinitions();
      cmsys::auto_ptr<cmMakefile> mfd(new cmMakefile(ggd.get(),
                                                    cm.GetCurrentSnapshot()));
      cmsys::auto_ptr<cmLocalGenerator> lgd(
            ggd->CreateLocalGenerator(mfd.get()));
      lgd->ClearDependencies(mfd.get(), verbose);
      }
    }

  // If any byproduct of makefile generation is missing we must re-run.
  std::vector<std::string> products;
  if(const char* productStr = mf->GetDefinition("CMAKE_MAKEFILE_PRODUCTS"))
    {
    cmSystemTools::ExpandListArgument(productStr, products);
    }
  for(std::vector<std::string>::const_iterator pi = products.begin();
      pi != products.end(); ++pi)
    {
    if(!(cmSystemTools::FileExists(pi->c_str()) ||
         cmSystemTools::FileIsSymlink(*pi)))
      {
      if(verbose)
        {
        std::ostringstream msg;
        msg << "Re-run cmake, missing byproduct: " << *pi << "\n";
        cmSystemTools::Stdout(msg.str().c_str());
        }
      return 1;
      }
    }

  // Get the set of dependencies and outputs.
  std::vector<std::string> depends;
  std::vector<std::string> outputs;
  const char* dependsStr = mf->GetDefinition("CMAKE_MAKEFILE_DEPENDS");
  const char* outputsStr = mf->GetDefinition("CMAKE_MAKEFILE_OUTPUTS");
  if(dependsStr && outputsStr)
    {
    cmSystemTools::ExpandListArgument(dependsStr, depends);
    cmSystemTools::ExpandListArgument(outputsStr, outputs);
    }
  if(depends.empty() || outputs.empty())
    {
    // Not enough information was provided to do the test.  Just rerun.
    if(verbose)
      {
      std::ostringstream msg;
      msg << "Re-run cmake no CMAKE_MAKEFILE_DEPENDS "
        "or CMAKE_MAKEFILE_OUTPUTS :\n";
      cmSystemTools::Stdout(msg.str().c_str());
      }
    return 1;
    }

  // Find the newest dependency.
  std::vector<std::string>::iterator dep = depends.begin();
  std::string dep_newest = *dep++;
  for(;dep != depends.end(); ++dep)
    {
    int result = 0;
    if(this->FileComparison->FileTimeCompare(dep_newest.c_str(),
                                             dep->c_str(), &result))
      {
      if(result < 0)
        {
        dep_newest = *dep;
        }
      }
    else
      {
      if(verbose)
        {
        std::ostringstream msg;
        msg << "Re-run cmake: build system dependency is missing\n";
        cmSystemTools::Stdout(msg.str().c_str());
        }
      return 1;
      }
    }

  // Find the oldest output.
  std::vector<std::string>::iterator out = outputs.begin();
  std::string out_oldest = *out++;
  for(;out != outputs.end(); ++out)
    {
    int result = 0;
    if(this->FileComparison->FileTimeCompare(out_oldest.c_str(),
                                             out->c_str(), &result))
      {
      if(result > 0)
        {
        out_oldest = *out;
        }
      }
    else
      {
      if(verbose)
        {
        std::ostringstream msg;
        msg << "Re-run cmake: build system output is missing\n";
        cmSystemTools::Stdout(msg.str().c_str());
        }
      return 1;
      }
    }

  // If any output is older than any dependency then rerun.
  {
  int result = 0;
  if(!this->FileComparison->FileTimeCompare(out_oldest.c_str(),
                                            dep_newest.c_str(),
                                            &result) ||
     result < 0)
    {
    if(verbose)
      {
      std::ostringstream msg;
      msg << "Re-run cmake file: " << out_oldest
          << " older than: " << dep_newest << "\n";
      cmSystemTools::Stdout(msg.str().c_str());
      }
    return 1;
    }
  }

  // No need to rerun.
  return 0;
}